

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

Ray * __thiscall Camera::GetRay(Camera *this,float s,float t)

{
  float fVar1;
  Vec3 *v;
  Vec3 *v_00;
  long in_RSI;
  Ray *in_RDI;
  float fVar2;
  double dVar3;
  float _time;
  Vec3 _origin;
  Vec3 _offset;
  Vec3 _rd;
  Vec3 *in_stack_ffffffffffffff00;
  Vec3 *in_stack_ffffffffffffff08;
  float t_00;
  undefined4 in_stack_ffffffffffffff24;
  Vec3 *in_stack_ffffffffffffff28;
  Ray *pRVar4;
  Vec3 local_b4;
  Vec3 local_a8;
  Vec3 local_9c;
  Vec3 local_90;
  Vec3 local_84;
  float local_78;
  Vec3 local_74;
  Vec3 local_68;
  Vec3 local_5c;
  Vec3 local_50 [2];
  byte local_31;
  Vec3 local_30;
  Vec3 local_24 [3];
  
  local_31 = 0;
  pRVar4 = in_RDI;
  if (*(float *)(in_RSI + 0x54) <= 0.0) {
    Vec3::Vec3(local_24,0.0,0.0,0.0);
  }
  else {
    in_stack_ffffffffffffff24 = *(undefined4 *)(in_RSI + 0x54);
    in_stack_ffffffffffffff28 = &local_30;
    random_in_unit_disk();
    local_31 = 1;
    operator*((float)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00);
  }
  if ((local_31 & 1) != 0) {
    Vec3::~Vec3(&local_30);
  }
  t_00 = (float)((ulong)(in_RSI + 0x30) >> 0x20);
  fVar2 = Vec3::x(local_24);
  operator*(in_stack_ffffffffffffff08,(float)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  v = (Vec3 *)(in_RSI + 0x3c);
  Vec3::y(local_24);
  operator*(v,(float)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  operator+(v,in_stack_ffffffffffffff00);
  Vec3::~Vec3(&local_68);
  Vec3::~Vec3(&local_5c);
  operator+(v,in_stack_ffffffffffffff00);
  fVar1 = *(float *)(in_RSI + 0x58);
  dVar3 = drand48();
  local_78 = (float)dVar3 * (*(float *)(in_RSI + 0x5c) - *(float *)(in_RSI + 0x58)) + fVar1;
  v_00 = (Vec3 *)(in_RSI + 0xc);
  operator*((float)((ulong)v >> 0x20),v_00);
  operator+(v,v_00);
  operator*((float)((ulong)v >> 0x20),v_00);
  operator+(v,v_00);
  operator-(v,v_00);
  Ray::Ray(pRVar4,in_stack_ffffffffffffff28,(Vec3 *)CONCAT44(in_stack_ffffffffffffff24,fVar2),t_00);
  Vec3::~Vec3(&local_84);
  Vec3::~Vec3(&local_90);
  Vec3::~Vec3(&local_b4);
  Vec3::~Vec3(&local_9c);
  Vec3::~Vec3(&local_a8);
  Vec3::~Vec3(&local_74);
  Vec3::~Vec3(local_50);
  Vec3::~Vec3(local_24);
  return in_RDI;
}

Assistant:

Ray
Camera::GetRay(float s, float t) const
{ 
    Vec3  _rd     = (m_lens_radius > 0.0f) ? m_lens_radius * random_in_unit_disk() : Vec3(0.0f, 0.0f, 0.0f);
    Vec3  _offset = m_u * _rd.x() + m_v * _rd.y();
    Vec3  _origin = m_origin + _offset;
    float _time   = m_time_open + RANDOM_GEN()*(m_time_close - m_time_open);

    return Ray(_origin, m_lower_left_corner + s*m_horizontal + t*m_vertical - _origin, _time);
}